

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

Wln_Ntk_t * Wln_NtkDupDfs(Wln_Ntk_t *p)

{
  Vec_Int_t *p_00;
  char *__s;
  int iVar1;
  int iVar2;
  int iVar3;
  int iObj;
  Wln_Ntk_t *pNew;
  size_t sVar4;
  char *__dest;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar5;
  
  pNew = Wln_NtkAlloc(p->pName,(p->vTypes).nSize);
  pNew->fSmtLib = p->fSmtLib;
  __s = p->pSpec;
  iVar5 = extraout_EDX;
  if (__s != (char *)0x0) {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
    pNew->pSpec = __dest;
    iVar5 = extraout_EDX_00;
  }
  p_00 = &p->vCopies;
  Vec_IntFill(p_00,(p->vTypes).nCap,iVar5);
  for (iVar5 = 0; iVar5 < (p->vCis).nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(&p->vCis,iVar5);
    Wln_ObjDup(pNew,p,iVar1);
  }
  for (iVar5 = 0; iVar5 < (p->vFfs).nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(&p->vFfs,iVar5);
    iVar2 = Wln_ObjClone(pNew,p,iVar1);
    Vec_IntWriteEntry(p_00,iVar1,iVar2);
  }
  for (iVar5 = 0; iVar5 < (p->vCos).nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(&p->vCos,iVar5);
    Wln_NtkDupDfs_rec(pNew,p,iVar1);
  }
  for (iVar5 = 0; iVar5 < (p->vFfs).nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(&p->vFfs,iVar5);
    for (iVar2 = 0; iVar2 < p->vFanins[iVar1].nSize; iVar2 = iVar2 + 1) {
      iVar3 = Wln_ObjFanin(p,iVar1,iVar2);
      if (iVar3 != 0) {
        iObj = Vec_IntEntry(p_00,iVar1);
        iVar3 = Wln_NtkDupDfs_rec(pNew,p,iVar3);
        Wln_ObjAddFanin(pNew,iObj,iVar3);
      }
    }
  }
  if (0 < (p->vNameIds).nSize) {
    Wln_NtkTransferNames(pNew,p);
  }
  return pNew;
}

Assistant:

Wln_Ntk_t * Wln_NtkDupDfs( Wln_Ntk_t * p )
{
    int i, k, iObj, iFanin;
    Wln_Ntk_t * pNew = Wln_NtkAlloc( p->pName, Wln_NtkObjNum(p) );
    pNew->fSmtLib = p->fSmtLib;
    if ( p->pSpec ) pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Wln_NtkCleanCopy( p );
    Wln_NtkForEachCi( p, iObj, i )
        Wln_ObjDup( pNew, p, iObj );
    Wln_NtkForEachFf( p, iObj, i )
        Wln_ObjSetCopy( p, iObj, Wln_ObjClone(pNew, p, iObj) );
    Wln_NtkForEachCo( p, iObj, i )
        Wln_NtkDupDfs_rec( pNew, p, iObj );
    Wln_NtkForEachFf( p, iObj, i )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjAddFanin( pNew, Wln_ObjCopy(p, iObj), Wln_NtkDupDfs_rec(pNew, p, iFanin) );
    if ( Wln_NtkHasNameId(p) )
        Wln_NtkTransferNames( pNew, p );
    return pNew;
}